

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_doregion(_glist *x,int xpos,int ypos,int doit)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  t_editor *ptVar4;
  int loy;
  uint lox;
  
  ptVar4 = x->gl_editor;
  uVar2 = ptVar4->e_xwas;
  if (doit == 0) {
    pdgui_vmess((char *)0x0,"crs iiii",x,"coords","x",(ulong)uVar2,(ulong)(uint)ptVar4->e_ywas,
                (ulong)(uint)xpos,(ulong)(uint)ypos);
  }
  else {
    lox = xpos;
    if ((int)uVar2 < xpos) {
      lox = uVar2;
    }
    if (xpos < (int)uVar2) {
      xpos = uVar2;
    }
    iVar3 = ptVar4->e_ywas;
    loy = ypos;
    if (iVar3 < ypos) {
      loy = iVar3;
    }
    if (ypos < iVar3) {
      ypos = iVar3;
    }
    canvas_selectinrect(x,lox,loy,xpos,ypos);
    pdgui_vmess((char *)0x0,"crs",x,"delete","x");
    puVar1 = &x->gl_editor->field_0x88;
    *puVar1 = *puVar1 & 0xf8;
  }
  return;
}

Assistant:

static void canvas_doregion(t_canvas *x, int xpos, int ypos, int doit)
{
    if (doit)
    {
        int lox, loy, hix, hiy;
        if (x->gl_editor->e_xwas < xpos)
            lox = x->gl_editor->e_xwas, hix = xpos;
        else hix = x->gl_editor->e_xwas, lox = xpos;
        if (x->gl_editor->e_ywas < ypos)
            loy = x->gl_editor->e_ywas, hiy = ypos;
        else hiy = x->gl_editor->e_ywas, loy = ypos;
        canvas_selectinrect(x, lox, loy, hix, hiy);
        pdgui_vmess(0, "crs", x, "delete", "x");
        x->gl_editor->e_onmotion = MA_NONE;
    }
    else
        pdgui_vmess(0, "crs iiii",
            x, "coords", "x",
            x->gl_editor->e_xwas,x->gl_editor->e_ywas, xpos,ypos);
}